

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
Descriptor_Parse_wsh_miniscript_Test::TestBody(Descriptor_Parse_wsh_miniscript_Test *this)

{
  bool bVar1;
  AddressType AVar2;
  HashType HVar3;
  DescriptorScriptType DVar4;
  char *in_R9;
  char *pcVar5;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_4;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_list;
  string local_5e8;
  AssertionResult gtest_ar_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list1;
  string descriptor;
  AssertionResult gtest_ar;
  string desc_str;
  string local_210;
  Script gen_script;
  Script locking_script;
  Descriptor desc;
  
  std::__cxx11::string::string
            ((string *)&descriptor,
             "wsh(thresh(2,multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),a:multi(1,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),ac:pk_k(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01)))"
             ,(allocator *)&gtest_ar);
  cfd::core::Descriptor::Descriptor(&desc);
  cfd::core::Script::Script(&locking_script);
  pcVar5 = "";
  std::__cxx11::string::string((string *)&desc_str,"",(allocator *)&gtest_ar);
  cfd::core::Script::Script(&gen_script);
  script_list.
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  script_list.
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  script_list.
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Descriptor::Parse
            ((Descriptor *)&gtest_ar,&descriptor,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=(&desc,(Descriptor *)&gtest_ar);
  cfd::core::DescriptorNode::~DescriptorNode((DescriptorNode *)&gtest_ar);
  arg_list1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_list1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arg_list1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                ((Descriptor *)&gtest_ar,&descriptor,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=(&desc,(Descriptor *)&gtest_ar);
      cfd::core::DescriptorNode::~DescriptorNode((DescriptorNode *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2fd,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_((string *)&gtest_ar,&desc,false);
      std::__cxx11::string::operator=((string *)&desc_str,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2fe,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript((Script *)&gtest_ar,&desc);
      cfd::core::Script::operator=(&locking_script,(Script *)&gtest_ar);
      cfd::core::Script::~Script((Script *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2ff,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript((Script *)&gtest_ar,&desc,&arg_list1);
      cfd::core::Script::operator=(&gen_script,(Script *)&gtest_ar);
      cfd::core::Script::~Script((Script *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x300,
               "Expected: gen_script = desc.GetLockingScript(arg_list1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReferenceAll
                ((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)&gtest_ar,&desc,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::_M_move_assign(&script_list,&gtest_ar);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                 *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x301,
               "Expected: script_list = desc.GetReferenceAll(nullptr) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"desc_str.c_str()","descriptor.c_str()",desc_str._M_dataplus._M_p
             ,descriptor._M_dataplus._M_p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x302,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar,&locking_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"locking_script.ToString().c_str()",
             "\"0 6a6c42f62db9fab091ffaf930e0a847646898d225e1ad94ff43226e20180b9d1\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "0 6a6c42f62db9fab091ffaf930e0a847646898d225e1ad94ff43226e20180b9d1");
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x304,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar,&gen_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"gen_script.ToString().c_str()",
             "\"0 6a6c42f62db9fab091ffaf930e0a847646898d225e1ad94ff43226e20180b9d1\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "0 6a6c42f62db9fab091ffaf930e0a847646898d225e1ad94ff43226e20180b9d1");
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x306,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1._0_8_ =
       ((long)script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)script_list.
             super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x350;
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"script_list.size()","1",(unsigned_long *)&gtest_ar_1,
             (int *)&gtest_ar_4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x308,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if ((long)script_list.
            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)script_list.
            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x350) {
    bVar1 = cfd::core::DescriptorScriptReference::HasAddress
                      (script_list.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    gtest_ar_1.success_ = bVar1;
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&gtest_ar_4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_1,
                 (AssertionResult *)"script_list[0].HasAddress()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_5e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x30a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_5e8,(Message *)&gtest_ar_4);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5e8);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_4);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    cfd::core::DescriptorScriptReference::GenerateAddress
              ((Address *)&gtest_ar,
               script_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start,kMainnet);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_1,(Address *)&gtest_ar);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_4,
               "script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str()",
               "\"bc1qdfky9a3dh8atpy0l47fsuz5ywergnrfztcddjnl5xgnwyqvqh8gschn2ch\"",
               (char *)gtest_ar_1._0_8_,
               "bc1qdfky9a3dh8atpy0l47fsuz5ywergnrfztcddjnl5xgnwyqvqh8gschn2ch");
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    cfd::core::Address::~Address((Address *)&gtest_ar);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_4.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x30c,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
    AVar2 = cfd::core::DescriptorScriptReference::GetAddressType
                      (script_list.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    gtest_ar_1._0_4_ = AVar2;
    gtest_ar_4.success_ = true;
    gtest_ar_4._1_3_ = 0;
    testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
              ((internal *)&gtest_ar,"script_list[0].GetAddressType()","AddressType::kP2wshAddress",
               (AddressType *)&gtest_ar_1,(AddressType *)&gtest_ar_4);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x30d,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_1)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    HVar3 = cfd::core::DescriptorScriptReference::GetHashType
                      (script_list.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    gtest_ar_1._0_4_ = HVar3;
    gtest_ar_4.success_ = true;
    gtest_ar_4._1_3_ = 0;
    testing::internal::CmpHelperEQ<cfd::core::HashType,cfd::core::HashType>
              ((internal *)&gtest_ar,"script_list[0].GetHashType()","HashType::kP2wsh",
               (HashType *)&gtest_ar_1,(HashType *)&gtest_ar_4);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x30e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_1)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    DVar4 = cfd::core::DescriptorScriptReference::GetScriptType
                      (script_list.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    gtest_ar_1._0_4_ = DVar4;
    gtest_ar_4.success_ = true;
    gtest_ar_4._1_3_ = 0;
    testing::internal::CmpHelperEQ<cfd::core::DescriptorScriptType,cfd::core::DescriptorScriptType>
              ((internal *)&gtest_ar,"script_list[0].GetScriptType()",
               "DescriptorScriptType::kDescriptorScriptWsh",(DescriptorScriptType *)&gtest_ar_1,
               (DescriptorScriptType *)&gtest_ar_4);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x30f,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_1)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    bVar1 = cfd::core::DescriptorScriptReference::HasChild
                      (script_list.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    gtest_ar_1.success_ = bVar1;
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&gtest_ar_4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_1,
                 (AssertionResult *)"script_list[0].HasChild()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_5e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x311,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_5e8,(Message *)&gtest_ar_4);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5e8);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_4);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    cfd::core::DescriptorScriptReference::GetRedeemScript
              ((Script *)&gtest_ar,
               script_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar_1,(Script *)&gtest_ar);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_4,"script_list[0].GetRedeemScript().ToString().c_str()",
               "\"2 03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7 036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00 2 OP_CHECKMULTISIG OP_TOALTSTACK 1 036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00 1 OP_CHECKMULTISIG OP_FROMALTSTACK OP_ADD OP_TOALTSTACK 022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01 OP_CHECKSIG OP_FROMALTSTACK OP_ADD 2 OP_EQUAL\""
               ,(char *)gtest_ar_1._0_8_,
               "2 03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7 036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00 2 OP_CHECKMULTISIG OP_TOALTSTACK 1 036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00 1 OP_CHECKMULTISIG OP_FROMALTSTACK OP_ADD OP_TOALTSTACK 022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01 OP_CHECKSIG OP_FROMALTSTACK OP_ADD 2 OP_EQUAL"
              );
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    cfd::core::Script::~Script((Script *)&gtest_ar);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_4.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x313,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
    cfd::core::DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)&gtest_ar,
               script_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar1 = cfd::core::DescriptorScriptReference::HasChild((DescriptorScriptReference *)&gtest_ar);
    gtest_ar_1.success_ = !bVar1;
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_1,
                 (AssertionResult *)"script_list[0].GetChild().HasChild()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_5e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x314,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_5e8,(Message *)&gtest_ar_4);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5e8);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_4);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    cfd::core::DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)&gtest_ar,
               script_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar1 = cfd::core::DescriptorScriptReference::HasKey((DescriptorScriptReference *)&gtest_ar);
    gtest_ar_1.success_ = !bVar1;
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_1,
                 (AssertionResult *)"script_list[0].GetChild().HasKey()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_5e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x315,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_5e8,(Message *)&gtest_ar_4);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5e8);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_4);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    cfd::core::DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)&gtest_ar,
               script_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript
                      ((DescriptorScriptReference *)&gtest_ar);
    gtest_ar_1.success_ = !bVar1;
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_1,
                 (AssertionResult *)"script_list[0].GetChild().HasRedeemScript()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_5e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x316,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_5e8,(Message *)&gtest_ar_4);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5e8);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_4);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    cfd::core::DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)&gtest_ar,
               script_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    gtest_ar_4._0_4_ =
         cfd::core::DescriptorScriptReference::GetScriptType((DescriptorScriptReference *)&gtest_ar)
    ;
    local_5e8._M_dataplus._M_p._0_4_ = 0xb;
    testing::internal::CmpHelperEQ<cfd::core::DescriptorScriptType,cfd::core::DescriptorScriptType>
              ((internal *)&gtest_ar_1,"script_list[0].GetChild().GetScriptType()",
               "DescriptorScriptType::kDescriptorScriptMiniscript",
               (DescriptorScriptType *)&gtest_ar_4,(DescriptorScriptType *)&local_5e8);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x317,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    cfd::core::DescriptorScriptReference::GetRedeemScript
              ((Script *)&gtest_ar_1,
               script_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cfd::core::Script::ToString_abi_cxx11_(&local_5e8,(Script *)&gtest_ar_1);
    pcVar5 = (char *)CONCAT44(local_5e8._M_dataplus._M_p._4_4_,local_5e8._M_dataplus._M_p._0_4_);
    cfd::core::DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)&gtest_ar,
               script_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cfd::core::DescriptorScriptReference::GetLockingScript
              ((Script *)&gtest_ar_4,(DescriptorScriptReference *)&gtest_ar);
    cfd::core::Script::ToString_abi_cxx11_(&local_210,(Script *)&gtest_ar_4);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_10,"script_list[0].GetRedeemScript().ToString().c_str()",
               "script_list[0].GetChild().GetLockingScript().ToString().c_str()",pcVar5,
               local_210._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_210);
    cfd::core::Script::~Script((Script *)&gtest_ar_4);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_5e8);
    cfd::core::Script::~Script((Script *)&gtest_ar_1);
    if (gtest_ar_10.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_10.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x319,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_10.message_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_list1);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector(&script_list);
  cfd::core::Script::~Script(&gen_script);
  std::__cxx11::string::~string((string *)&desc_str);
  cfd::core::Script::~Script(&locking_script);
  cfd::core::DescriptorNode::~DescriptorNode(&desc.root_node_);
  std::__cxx11::string::~string((string *)&descriptor);
  return;
}

Assistant:

TEST(Descriptor, Parse_wsh_miniscript) {
  std::string descriptor = "wsh(thresh(2,multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),a:multi(1,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),ac:pk_k(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01)))";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  Script gen_script;
  std::vector<DescriptorScriptReference> script_list;

  try {
    desc = Descriptor::Parse(descriptor);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  std::vector<std::string> arg_list1;
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(gen_script = desc.GetLockingScript(arg_list1));
  EXPECT_NO_THROW(script_list = desc.GetReferenceAll(nullptr));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
    "0 6a6c42f62db9fab091ffaf930e0a847646898d225e1ad94ff43226e20180b9d1");
  EXPECT_STREQ(gen_script.ToString().c_str(),
    "0 6a6c42f62db9fab091ffaf930e0a847646898d225e1ad94ff43226e20180b9d1");

  EXPECT_EQ(script_list.size(), 1);
  if (script_list.size() == 1) {
    EXPECT_TRUE(script_list[0].HasAddress());
    EXPECT_STREQ(script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "bc1qdfky9a3dh8atpy0l47fsuz5ywergnrfztcddjnl5xgnwyqvqh8gschn2ch");
    EXPECT_EQ(script_list[0].GetAddressType(), AddressType::kP2wshAddress);
    EXPECT_EQ(script_list[0].GetHashType(), HashType::kP2wsh);
    EXPECT_EQ(script_list[0].GetScriptType(), DescriptorScriptType::kDescriptorScriptWsh);

    EXPECT_TRUE(script_list[0].HasChild());
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
      "2 03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7 036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00 2 OP_CHECKMULTISIG OP_TOALTSTACK 1 036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00 1 OP_CHECKMULTISIG OP_FROMALTSTACK OP_ADD OP_TOALTSTACK 022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01 OP_CHECKSIG OP_FROMALTSTACK OP_ADD 2 OP_EQUAL");
    EXPECT_FALSE(script_list[0].GetChild().HasChild());
    EXPECT_FALSE(script_list[0].GetChild().HasKey());
    EXPECT_FALSE(script_list[0].GetChild().HasRedeemScript());
    EXPECT_EQ(script_list[0].GetChild().GetScriptType(), DescriptorScriptType::kDescriptorScriptMiniscript);
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
      script_list[0].GetChild().GetLockingScript().ToString().c_str());
  }
}